

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandWriteWlc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Wlc_Ntk_t *pWVar4;
  char *pcVar5;
  uint fAddCos;
  char *pcVar6;
  uint local_3c;
  
  pWVar4 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  fAddCos = 0;
  Extra_UtilGetoptReset();
  bVar1 = false;
  local_3c = 0;
  bVar2 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar3 = Extra_UtilGetopt(argc,argv,"anfvh"), iVar3 == 0x76) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        if (0x65 < iVar3) break;
        if (iVar3 == -1) {
          if (pWVar4 == (Wlc_Ntk_t *)0x0) {
            Abc_Print(1,"Abc_CommandWriteWlc(): There is no current design.\n");
            return 0;
          }
          if (globalUtilOptind == argc) {
            pcVar5 = Extra_FileNameGenericAppend(pWVar4->pName,"_out.v");
          }
          else {
            if (globalUtilOptind + 1 != argc) {
              puts("Output file name should be given on the command line.");
              return 0;
            }
            pcVar5 = argv[globalUtilOptind];
          }
          if (bVar1) {
            pWVar4 = Wlc_NtkDupSingleNodes(pWVar4);
            Wlc_WriteVer(pWVar4,pcVar5,fAddCos,local_3c);
            Wlc_NtkFree(pWVar4);
          }
          else {
            Wlc_WriteVer(pWVar4,pcVar5,fAddCos,local_3c);
          }
          return 0;
        }
        if (iVar3 != 0x61) goto LAB_0030b7f4;
        fAddCos = fAddCos ^ 1;
      }
      if (iVar3 != 0x66) break;
      local_3c = local_3c ^ 1;
    }
    if (iVar3 != 0x6e) break;
    bVar1 = (bool)(bVar1 ^ 1);
  }
LAB_0030b7f4:
  Abc_Print(-2,"usage: %%write [-anfvh]\n");
  Abc_Print(-2,"\t         writes the design into a file\n");
  pcVar6 = "yes";
  pcVar5 = "yes";
  if (fAddCos == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle adding a CO for each node [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-n     : toggle splitting into individual nodes [default = %s]\n",pcVar5);
  pcVar5 = "yes";
  if (local_3c == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-f     : toggle skipping flops when writing file [default = %s]\n",pcVar5);
  if (!bVar2) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandWriteWlc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    char * pFileName = NULL;
    int fAddCos      =    0; 
    int fSplitNodes  =    0; 
    int fNoFlops     =    0;
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "anfvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fAddCos ^= 1;
            break;
        case 'n':
            fSplitNodes ^= 1;
            break;
        case 'f':
            fNoFlops ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandWriteWlc(): There is no current design.\n" );
        return 0;
    }
    if ( argc == globalUtilOptind )
        pFileName = Extra_FileNameGenericAppend( pNtk->pName, "_out.v" );
    else if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    if ( fSplitNodes )
    {
        pNtk = Wlc_NtkDupSingleNodes( pNtk );
        Wlc_WriteVer( pNtk, pFileName, fAddCos, fNoFlops );
        Wlc_NtkFree( pNtk );
    }
    else
        Wlc_WriteVer( pNtk, pFileName, fAddCos, fNoFlops );

    return 0;
usage:
    Abc_Print( -2, "usage: %%write [-anfvh]\n" );
    Abc_Print( -2, "\t         writes the design into a file\n" );
    Abc_Print( -2, "\t-a     : toggle adding a CO for each node [default = %s]\n",       fAddCos? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle splitting into individual nodes [default = %s]\n", fSplitNodes? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle skipping flops when writing file [default = %s]\n",fNoFlops? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}